

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::basic_string_view<char>,_char[3]>
* fmt::v9::
  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,fmt::v9::basic_string_view<char>&,char_const(&)[3]>
            (basic_string_view<char> *args,char (*args_1) [3])

{
  size_t sVar1;
  size_t in_RDX;
  undefined8 *in_RSI;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_fmt::v9::basic_string_view<char>,_char[3]>
  *in_RDI;
  basic_string_view<char> s;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  basic_string_view<char> *arg;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  undefined1 local_d9;
  char *local_d8;
  size_t sStack_d0;
  char **local_c8;
  char *local_b8 [2];
  detail *local_a8;
  char *pcStack_a0;
  undefined1 *local_88;
  basic_string_view<char> local_80;
  char **local_70;
  basic_string_view<char> local_68 [3];
  size_t local_30;
  
  local_88 = &local_d9;
  local_a8 = (detail *)*in_RSI;
  pcStack_a0 = (char *)in_RSI[1];
  s.size_ = in_RDX;
  s.data_ = pcStack_a0;
  local_80 = detail::to_string_view<char>(local_a8,s);
  local_d8 = local_80.data_;
  sStack_d0 = local_80.size_;
  local_c8 = &local_d8;
  local_68[0].data_ = local_80.data_;
  local_68[0].size_ = local_80.size_;
  local_70 = local_b8;
  local_b8[0] = basic_string_view<char>::data(local_68);
  sVar1 = basic_string_view<char>::size(local_68);
  (in_RDI->data_).args_[0].field_0.string.data = local_b8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.long_long_value = in_RDX;
  (in_RDI->data_).args_[1].field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {FMT_FORWARD(args)...};
}